

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

Memory * LiteScript::Memory::Load(Memory *__return_storage_ptr__,istream *stream)

{
  pointer *pppTVar1;
  iterator __position;
  uint *puVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_> *pvVar10;
  ulong uVar11;
  ulong uVar12;
  Type **__args;
  string str;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  uint *local_40;
  vector<LiteScript::Type*,std::allocator<LiteScript::Type*>> *local_38;
  
  __return_storage_ptr__->first_nfull = 0;
  *(undefined8 *)&__return_storage_ptr__->count = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->type_list).
           super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (__return_storage_ptr__->type_list).
  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->type_list).
  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->Count = &__return_storage_ptr__->count;
  memset(__return_storage_ptr__,0,0x800);
  lVar9 = 0x400;
  do {
    *(short *)((long)(__return_storage_ptr__->arr)._M_elems + lVar9 * 2) = (short)lVar9 + -0x3ff;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x500);
  pvVar10 = Type::GetTypesList();
  local_40 = &__return_storage_ptr__->count;
  uVar4 = std::istream::get();
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  iVar7 = std::istream::get();
  uVar4 = (uVar6 & 0xff) << 0x10 | iVar7 << 0x18 | (uVar5 & 0xff) << 8 | uVar4 & 0xff;
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  if (uVar4 != 0) {
    local_38 = (vector<LiteScript::Type*,std::allocator<LiteScript::Type*>> *)
               &__return_storage_ptr__->type_list;
    uVar5 = 0;
    do {
      local_58 = 0;
      *local_60 = 0;
      while (cVar3 = std::istream::get(), cVar3 != '\0') {
        std::__cxx11::string::push_back((char)&local_60);
      }
      uVar11 = (long)(pvVar10->
                     super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar10->
                     super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
                     _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          Type::GetName(*(Type **)((long)(pvVar10->
                                         super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar12));
          iVar7 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar7 == 0) {
            __args = (Type **)(uVar12 + (long)(pvVar10->
                                              super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start);
            __position._M_current =
                 (__return_storage_ptr__->type_list).
                 super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<LiteScript::Type*,std::allocator<LiteScript::Type*>>::
              _M_realloc_insert<LiteScript::Type*const&>(local_38,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              pppTVar1 = &(__return_storage_ptr__->type_list).
                          super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            break;
          }
          uVar12 = uVar12 + 8;
        } while (uVar11 != uVar12);
      }
      if ((long)(__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == (ulong)uVar5) {
        if (local_60 == local_50) {
          return __return_storage_ptr__;
        }
        operator_delete(local_60);
        return __return_storage_ptr__;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  uVar8 = std::istream::get();
  iVar7 = std::istream::get();
  puVar2 = local_40;
  uVar4 = *local_40;
  while (uVar4 < ((uVar8 & 0xff) << 0x10 | iVar7 << 0x18 | (uVar6 & 0xff) << 8 | uVar5 & 0xff)) {
    LoadVariable(__return_storage_ptr__,stream);
    uVar4 = *puVar2 + 1;
    *puVar2 = uVar4;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Memory LiteScript::Memory::Load(std::istream &stream) {
    Memory memory;
    const std::vector<Type *>& types = Type::GetTypesList();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string str;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        str.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            str += c;
        for (unsigned int j = 0, sz_j = types.size(); j < sz_j; j++) {
            if (str == types[j]->GetName()) {
                memory.type_list.push_back(types[j]);
                break;
            }
        }
        if (i == memory.type_list.size())
            return memory;
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (; memory.count < sz; memory.count++)
        memory.LoadVariable(stream);
    return memory;
}